

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O3

void __thiscall OPLio::OPLwriteInstrument(OPLio *this,uint channel,OPL2instrument *instr)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint which;
  
  uVar2 = OPLwriteChannel::op_num[channel % 9];
  uVar3 = channel / 9;
  (*this->_vptr_OPLio[4])(this,channel / 9,(ulong)(uVar2 + 0x40),0x3f);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0x43),0x3f);
  bVar1 = instr->trem_vibr_2;
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0x20),(ulong)instr->trem_vibr_1);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0x23),(ulong)bVar1);
  bVar1 = instr->att_dec_2;
  uVar3 = channel / 9;
  (*this->_vptr_OPLio[4])(this,channel / 9,(ulong)(uVar2 + 0x60),(ulong)instr->att_dec_1);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 99),(ulong)bVar1);
  bVar1 = instr->sust_rel_2;
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0x80),(ulong)instr->sust_rel_1);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0x83),(ulong)bVar1);
  bVar1 = instr->wave_2;
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0xe0),(ulong)instr->wave_1);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(uVar2 + 0xe3),(ulong)bVar1);
  (*this->_vptr_OPLio[4])(this,uVar3,(ulong)(channel % 9 + 0xc0),(ulong)(instr->feedback | 0x30));
  return;
}

Assistant:

void OPLio::OPLwriteInstrument(uint channel, struct OPL2instrument *instr)
{
	OPLwriteChannel(0x40, channel, 0x3F, 0x3F);		// no volume
	OPLwriteChannel(0x20, channel, instr->trem_vibr_1, instr->trem_vibr_2);
	OPLwriteChannel(0x60, channel, instr->att_dec_1,   instr->att_dec_2);
	OPLwriteChannel(0x80, channel, instr->sust_rel_1,  instr->sust_rel_2);
	OPLwriteChannel(0xE0, channel, instr->wave_1,      instr->wave_2);
	OPLwriteValue  (0xC0, channel, instr->feedback | 0x30);
}